

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

bool __thiscall Catch::AssertionHandler::allowThrows(AssertionHandler *this)

{
  undefined1 uVar1;
  int iVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  
  pIVar3 = getCurrentMutableContext();
  iVar2 = (*(pIVar3->super_IContext)._vptr_IContext[4])(pIVar3);
  uVar1 = (**(code **)(**(long **)CONCAT44(extraout_var,iVar2) + 0x10))();
  return (bool)uVar1;
}

Assistant:

auto AssertionHandler::allowThrows() const -> bool {
        return getCurrentContext().getConfig()->allowThrows();
    }